

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O2

int detect_form(archive_read *a,int *is_form_d)

{
  byte *pbVar1;
  ssize_t sVar2;
  char cVar3;
  int iVar4;
  byte *pbVar5;
  void *pvVar6;
  ssize_t sVar7;
  long lVar8;
  byte *pbVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  byte bVar13;
  long lVar14;
  ulong uVar15;
  byte *__s1;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  bool bVar19;
  ulong uStack_70;
  int local_68;
  int local_64;
  ssize_t avail;
  archive_read *local_48;
  ssize_t nl;
  undefined8 local_38;
  
  if (is_form_d != (int *)0x0) {
    *is_form_d = 0;
  }
  local_48 = a;
  pbVar5 = (byte *)__archive_read_ahead(a,1,&avail);
  if (pbVar5 == (byte *)0x0) {
    iVar4 = -1;
  }
  else {
    local_64 = 0;
    cVar3 = '\0';
    local_68 = 0;
    lVar16 = avail;
LAB_00200268:
    uVar17 = avail;
    if (avail == 0) {
      nl = 0;
      uStack_70 = 0;
    }
    else {
      uStack_70 = get_line_size((char *)pbVar5,avail,&nl);
    }
    bVar19 = false;
    while (nl == 0) {
      if ((bVar19) || (uVar17 != uStack_70)) goto LAB_0020069c;
      uVar18 = (ulong)((int)lVar16 + 0x3ffU & 0xfffffc00);
      pvVar6 = __archive_read_ahead(local_48,uVar18 << (uVar18 < lVar16 + 0xa0U),&avail);
      if (pvVar6 == (void *)0x0) {
        if (avail <= lVar16) {
          uStack_70 = 0;
          goto LAB_0020069c;
        }
        pvVar6 = __archive_read_ahead(local_48,avail,&avail);
        bVar19 = true;
      }
      else {
        bVar19 = false;
      }
      sVar2 = avail;
      pbVar5 = (byte *)((long)pvVar6 + (lVar16 - uVar17));
      uVar18 = avail - (lVar16 - uVar17);
      avail = uVar18;
      sVar7 = get_line_size((char *)pbVar5,uVar18,&nl);
      uStack_70 = 0;
      if (-1 < sVar7) {
        uStack_70 = uVar17;
      }
      uStack_70 = uStack_70 + sVar7;
      lVar16 = sVar2;
      uVar17 = uVar18;
    }
    if (0 < (long)uStack_70) {
      uVar18 = ~nl;
      if (cVar3 != '\0') {
        iVar4 = bid_keyword_list((char *)pbVar5,uStack_70,0,0);
        if (iVar4 < 1) {
          uStack_70 = 1;
          goto LAB_0020069c;
        }
        pbVar5 = pbVar5 + uStack_70;
        if ((pbVar5[uVar18] != 0x5c) && (bVar19 = cVar3 == '\x01', cVar3 = '\0', bVar19)) {
          if (1 < local_64) goto LAB_002006b0;
          local_64 = local_64 + 1;
          cVar3 = '\0';
        }
        avail = uVar17 - uStack_70;
        goto LAB_00200268;
      }
      pbVar1 = pbVar5 + uStack_70;
      pbVar9 = pbVar5 + uVar18;
      uVar10 = uVar17;
      for (uVar12 = uStack_70; uVar10 = uVar10 - 1, 0 < (long)uVar12; uVar12 = uVar12 - 1) {
        bVar13 = *pbVar5;
        if ((bVar13 != 0x20) && (uStack_70 = uVar12, __s1 = pbVar5, bVar13 != 9)) goto LAB_00200407;
        pbVar5 = pbVar5 + 1;
        uVar17 = uVar17 - 1;
        pbVar9 = pbVar9 + 1;
        avail = uVar10;
      }
      bVar13 = *pbVar1;
      uStack_70 = 0;
      __s1 = pbVar1;
LAB_00200407:
      if (((bVar13 == 10) || (bVar13 == 0xd)) || (bVar13 == 0x23)) {
        if ((long)uVar12 < 1) {
          uVar12 = 0;
        }
LAB_0020042d:
        pbVar5 = __s1 + uStack_70;
        avail = uVar17 - uVar12;
        goto LAB_00200268;
      }
      if (bVar13 == 0x2f) {
        iVar4 = strncmp((char *)__s1,"/set",4);
        if (iVar4 == 0) {
          pbVar5 = __s1 + 4;
          lVar8 = uStack_70 - 4;
          iVar4 = 0;
        }
        else {
          iVar4 = strncmp((char *)__s1,"/unset",6);
          if (iVar4 != 0) goto LAB_0020069c;
          pbVar5 = __s1 + 6;
          lVar8 = uStack_70 - 6;
          iVar4 = 1;
        }
        iVar4 = bid_keyword_list((char *)pbVar5,lVar8,iVar4,0);
        if (iVar4 < 1) goto LAB_0020069c;
        cVar3 = (__s1[uVar18 + uStack_70] == 0x5c) * '\x02';
LAB_00200679:
        if ((long)uVar12 < 1) {
          uVar12 = 0;
        }
        goto LAB_0020042d;
      }
      lVar8 = -nl;
      uVar11 = (long)uVar12 >> 0x3f & uVar12;
      lVar14 = 0;
      for (uVar10 = uStack_70; 0 < (long)uVar10; uVar10 = uVar10 - 1) {
        uVar15 = (ulong)pbVar5[lVar14 + uVar11];
        if ((uVar15 < 0x21) && ((0x100002600U >> (uVar15 & 0x3f) & 1) != 0)) goto LAB_00200507;
        if (bid_entry_safe_char[uVar15] == '\0') goto LAB_00200524;
        lVar14 = lVar14 + 1;
      }
      uVar10 = 0;
LAB_00200507:
      if ((int)lVar14 == 0) {
LAB_00200524:
        if ((((__s1 + lVar8 + uStack_70 + -2 < __s1) || (__s1[lVar8 + uStack_70 + -1] != 0x5c)) ||
            ((bVar13 = __s1[lVar8 + uStack_70 + -2], bVar13 != 9 && (bVar13 != 0x20)))) &&
           ((__s1 + lVar8 + uStack_70 + -1 < __s1 || (__s1[lVar8 + uStack_70 + -1] != 0x5c)))) {
          lVar14 = 0;
          uVar10 = 0;
          if (0 < (long)uVar12) {
            uVar10 = uVar12;
          }
          bVar19 = false;
          for (pbVar9 = pbVar9 + uVar10 + uVar11; __s1 <= pbVar9; pbVar9 = pbVar9 + -1) {
            bVar13 = *pbVar9;
            if ((bVar13 == 9) || (bVar13 == 0x20)) break;
            if (bid_entry_safe_char[bVar13] == '\0') goto LAB_0020069c;
            if (bVar13 == 0x2f) {
              bVar19 = true;
            }
            lVar14 = lVar14 + 1;
          }
          if ((((int)lVar14 != 0) && (bVar19)) && (pbVar9[1] != 0x2f)) {
            local_38 = 0;
            uVar10 = 0;
            if (0 < (long)uVar12) {
              uVar10 = uVar12;
            }
            uVar10 = (lVar8 + uVar10) - lVar14;
            iVar4 = 1;
            pbVar5 = __s1;
            goto LAB_002005f2;
          }
        }
      }
      else {
        pbVar5 = pbVar5 + uVar11 + lVar14;
        iVar4 = 0;
        local_38 = CONCAT71((int7)((ulong)lVar8 >> 8),1);
LAB_002005f2:
        iVar4 = bid_keyword_list((char *)pbVar5,uVar10,0,iVar4);
        if (iVar4 < 0) goto LAB_0020069c;
        bVar13 = (byte)local_38;
        if (local_68 != 1) {
          if (local_68 == 0) {
            local_68 = 1;
            if (bVar13 != 0) {
              local_68 = -(uint)(iVar4 != 0);
LAB_0020064b:
              if (__s1[uVar18 + uStack_70] == 0x5c) {
                cVar3 = '\x01';
                goto LAB_00200679;
              }
            }
          }
          else {
LAB_00200646:
            if (bVar13 != 0) goto LAB_0020064b;
          }
          if (local_64 < 2) {
            local_64 = local_64 + 1;
            cVar3 = '\0';
            goto LAB_00200679;
          }
          goto LAB_002006b0;
        }
        if ((bVar13 & iVar4 != 0) == 0) goto LAB_00200646;
        local_68 = 1;
      }
    }
LAB_0020069c:
    if (local_64 < 3) {
      if (local_64 < 1) {
        return 0;
      }
      if (uStack_70 != 0) {
        return 0;
      }
    }
LAB_002006b0:
    iVar4 = 0x20;
    if ((is_form_d != (int *)0x0) && (local_68 == 1)) {
      *is_form_d = 1;
    }
  }
  return iVar4;
}

Assistant:

static int
detect_form(struct archive_read *a, int *is_form_d)
{
	const char *p;
	ssize_t avail, ravail;
	ssize_t detected_bytes = 0, len, nl;
	int entry_cnt = 0, multiline = 0;
	int form_D = 0;/* The archive is generated by `NetBSD mtree -D'
			* (In this source we call it `form D') . */

	if (is_form_d != NULL)
		*is_form_d = 0;
	p = __archive_read_ahead(a, 1, &avail);
	if (p == NULL)
		return (-1);
	ravail = avail;
	for (;;) {
		len = next_line(a, &p, &avail, &ravail, &nl);
		/* The terminal character of the line should be
		 * a new line character, '\r\n' or '\n'. */
		if (len <= 0 || nl == 0)
			break;
		if (!multiline) {
			/* Leading whitespace is never significant,
			 * ignore it. */
			while (len > 0 && (*p == ' ' || *p == '\t')) {
				++p;
				--avail;
				--len;
			}
			/* Skip comment or empty line. */ 
			if (p[0] == '#' || p[0] == '\n' || p[0] == '\r') {
				p += len;
				avail -= len;
				continue;
			}
		} else {
			/* A continuance line; the terminal
			 * character of previous line was '\' character. */
			if (bid_keyword_list(p, len, 0, 0) <= 0)
				break;
			if (multiline == 1)
				detected_bytes += len;
			if (p[len-nl-1] != '\\') {
				if (multiline == 1 &&
				    ++entry_cnt >= MAX_BID_ENTRY)
					break;
				multiline = 0;
			}
			p += len;
			avail -= len;
			continue;
		}
		if (p[0] != '/') {
			int last_is_path, keywords;

			keywords = bid_entry(p, len, nl, &last_is_path);
			if (keywords >= 0) {
				detected_bytes += len;
				if (form_D == 0) {
					if (last_is_path)
						form_D = 1;
					else if (keywords > 0)
						/* This line is not `form D'. */
						form_D = -1;
				} else if (form_D == 1) {
					if (!last_is_path && keywords > 0)
						/* This this is not `form D'
						 * and We cannot accept mixed
						 * format. */
						break;
				}
				if (!last_is_path && p[len-nl-1] == '\\')
					/* This line continues. */
					multiline = 1;
				else {
					/* We've got plenty of correct lines
					 * to assume that this file is a mtree
					 * format. */
					if (++entry_cnt >= MAX_BID_ENTRY)
						break;
				}
			} else
				break;
		} else if (strncmp(p, "/set", 4) == 0) {
			if (bid_keyword_list(p+4, len-4, 0, 0) <= 0)
				break;
			/* This line continues. */
			if (p[len-nl-1] == '\\')
				multiline = 2;
		} else if (strncmp(p, "/unset", 6) == 0) {
			if (bid_keyword_list(p+6, len-6, 1, 0) <= 0)
				break;
			/* This line continues. */
			if (p[len-nl-1] == '\\')
				multiline = 2;
		} else
			break;

		/* Test next line. */
		p += len;
		avail -= len;
	}
	if (entry_cnt >= MAX_BID_ENTRY || (entry_cnt > 0 && len == 0)) {
		if (is_form_d != NULL) {
			if (form_D == 1)
				*is_form_d = 1;
		}
		return (32);
	}

	return (0);
}